

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projections.c
# Opt level: O0

void icetProjectTile(IceTInt tile,IceTDouble *mat_out)

{
  IceTDouble *B;
  IceTDouble local_158;
  IceTDouble viewport_proj [16];
  IceTDouble *global_proj;
  IceTDouble tile_viewport_proj [16];
  IceTDouble *tile_proj;
  IceTInt renderable_height;
  IceTInt renderable_width;
  IceTInt tile_height;
  IceTInt tile_width;
  IceTDouble *tile_projections;
  IceTInt *viewports;
  IceTDouble *pIStack_18;
  IceTInt num_tiles;
  IceTDouble *mat_out_local;
  IceTInt tile_local;
  
  pIStack_18 = mat_out;
  mat_out_local._4_4_ = tile;
  update_tile_projections();
  icetGetIntegerv(0x10,(IceTInt *)((long)&viewports + 4));
  if ((mat_out_local._4_4_ < 0) || (viewports._4_4_ <= mat_out_local._4_4_)) {
    icetRaiseDiagnostic("Bad tile passed to icetProjectTile.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/projections.c"
                        ,0x29);
  }
  else {
    tile_projections = (IceTDouble *)icetUnsafeStateGetInteger(0x11);
    renderable_width =
         *(IceTInt *)((long)tile_projections + (long)(mat_out_local._4_4_ * 4 + 2) * 4);
    renderable_height =
         *(IceTInt *)((long)tile_projections + (long)(mat_out_local._4_4_ * 4 + 3) * 4);
    icetGetIntegerv(7,(IceTInt *)((long)&tile_proj + 4));
    icetGetIntegerv(8,(IceTInt *)&tile_proj);
    _tile_height = icetUnsafeStateGetDouble(0x94);
    tile_viewport_proj[0xf] = (IceTDouble)(_tile_height + (mat_out_local._4_4_ << 4));
    if ((tile_proj._4_4_ == renderable_width) && ((int)tile_proj == renderable_height)) {
      memcpy(&global_proj,(void *)tile_viewport_proj[0xf],0x80);
    }
    else {
      icetMatrixOrtho(-1.0,(IceTDouble)
                           (((double)tile_proj._4_4_ * 2.0) / (double)renderable_width - 1.0),-1.0,
                      (IceTDouble)(((double)(int)tile_proj * 2.0) / (double)renderable_height - 1.0)
                      ,1.0,-1.0,&local_158);
      icetMatrixMultiply((IceTDouble *)&global_proj,&local_158,(IceTDouble *)tile_viewport_proj[0xf]
                        );
    }
    B = icetUnsafeStateGetDouble(0x81);
    icetMatrixMultiply(pIStack_18,(IceTDouble *)&global_proj,B);
  }
  return;
}

Assistant:

void icetProjectTile(IceTInt tile, IceTDouble *mat_out)
{
    IceTInt num_tiles;
    const IceTInt *viewports;
    const IceTDouble *tile_projections;
    IceTInt tile_width, tile_height;
    IceTInt renderable_width, renderable_height;
    const IceTDouble *tile_proj;
    IceTDouble tile_viewport_proj[16];
    const IceTDouble *global_proj;

  /* Update tile projections. */
    update_tile_projections();

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    if ((tile < 0) || (tile >= num_tiles)) {
        icetRaiseError("Bad tile passed to icetProjectTile.",
                       ICET_INVALID_VALUE);
        return;
    }

    viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    tile_width = viewports[tile*4+2];
    tile_height = viewports[tile*4+3];
    icetGetIntegerv(ICET_PHYSICAL_RENDER_WIDTH, &renderable_width);
    icetGetIntegerv(ICET_PHYSICAL_RENDER_HEIGHT, &renderable_height);
    tile_projections = icetUnsafeStateGetDouble(ICET_TILE_PROJECTIONS);

    tile_proj = tile_projections + 16*tile;

    if ((renderable_width != tile_width) || (renderable_height != tile_height)){
      /* Compensate for fact that tile is smaller than actual window.
         Use an orthographic projection to place the tile in the lower left
         corner of the tile. */
        IceTDouble viewport_proj[16];
        icetMatrixOrtho(-1.0, 2.0*renderable_width/tile_width - 1.0,
                        -1.0, 2.0*renderable_height/tile_height - 1.0,
                        1.0, -1.0, viewport_proj);

        icetMatrixMultiply(tile_viewport_proj,
                           (const IceTDouble *)viewport_proj,
                           (const IceTDouble *)tile_proj);
    } else {
        memcpy(tile_viewport_proj, (const IceTDouble*)tile_proj,
               16*sizeof(IceTDouble));
    }

  /* Project the user requested view to the tile projection. */
    global_proj = icetUnsafeStateGetDouble(ICET_PROJECTION_MATRIX);
    icetMatrixMultiply(mat_out,
                       (const IceTDouble *)tile_viewport_proj,
                       (const IceTDouble *)global_proj);
}